

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

BOOL __thiscall Memory::Recycler::FinishConcurrentCollect(Recycler *this,CollectionFlags flags)

{
  ObservableValue<Memory::CollectionState> *pOVar1;
  ObservableValueObserver<Memory::CollectionState> *pOVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  CollectionFlags flags_00;
  BOOL BVar6;
  DWORD waitTime;
  undefined4 *puVar7;
  size_t rescanRootBytes;
  Phase phase;
  undefined1 local_40 [8];
  AutoProtectPages protectPages;
  
  if (((this->collectionState).value & Collection_Concurrent) == CollectionStateNotCollecting) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x16e9,"(false)","false");
    if (bVar4) {
      *puVar7 = 0;
      return 0;
    }
LAB_0071249e:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  if ((flags >> 0x1c & 1) == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if ((this->priorityBoost & 1U) != 0) {
      bVar4 = this->backgroundRescanCount != '\x01';
    }
  }
  (this->collectionParam).priorityBoostConcurrentSweepOverride = this->priorityBoost;
  flags_00 = 0xffffffff;
  if ((flags >> 0xe & 1) == 0) {
    flags_00 = RecyclerHeuristic::FinishConcurrentCollectWaitTime(this->recyclerFlagsTable);
  }
  BVar6 = WaitForConcurrentThread(this,flags_00,WaitReasonNone);
  if (BVar6 == 0) {
    return 0;
  }
  pOVar1 = &this->collectionState;
  if (pOVar1->value != CollectionStateTransferSweptWait) {
    if (pOVar1->value == CollectionStateRescanWait) {
      phase = ConcurrentMarkPhase;
      if (this->inPartialCollectMode != false) {
        phase = ConcurrentPartialCollectPhase;
      }
      PrintCollectTrace(this,phase,true,false);
      local_40._0_4_ = CollectionStateRescanFindRoots;
      pOVar2 = (this->collectionState).observer;
      if ((pOVar2 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
         ((this->collectionState).value != CollectionStateRescanFindRoots)) {
        (**pOVar2->_vptr_ObservableValueObserver)(pOVar2,local_40,pOVar1);
      }
      (this->collectionState).value = local_40._0_4_;
      if ((this->isPageHeapEnabled == true) &&
         (this->recyclerFlagsTable->RecyclerProtectPagesOnRescan == true)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x1723,
                           "(!(IsPageHeapEnabled() && GetRecyclerFlagsTable().RecyclerProtectPagesOnRescan))"
                           ,"ProtectPagesOnRescan not supported in page heap mode");
        if (!bVar5) goto LAB_0071249e;
        *puVar7 = 0;
      }
      AutoProtectPages::AutoProtectPages
                ((AutoProtectPages *)local_40,this,
                 this->recyclerFlagsTable->RecyclerProtectPagesOnRescan);
      if (((flags >> 0xe & 1) == 0 & bVar4) == 1) {
        bVar5 = (bool)((byte)(flags >> 0x14) & 1);
      }
      else {
        bVar5 = false;
      }
      waitTime = RecyclerHeuristic::BackgroundFinishMarkWaitTime(bVar5,this->recyclerFlagsTable);
      rescanRootBytes = FinishMark(this,waitTime);
      if (rescanRootBytes == 0xffffffffffffffff) {
        if ((pOVar1->value & CollectionStateMark) == CollectionStateNotCollecting) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0x172d,"(this->IsMarkState())","this->IsMarkState()");
          if (!bVar4) goto LAB_0071249e;
          *puVar7 = 0;
        }
        AutoProtectPages::~AutoProtectPages((AutoProtectPages *)local_40);
        return 0;
      }
      (this->collectionStats).continueCollectAllocBytes = (this->autoHeap).uncollectedAllocBytes;
      if (this->recyclerFlagsTable->RecyclerVerifyMark == true) {
        VerifyMarkRoots(this);
        HeapInfoManager::VerifyMark(&this->autoHeap);
      }
      if ((char)protectPages.recycler == '\x01') {
        HeapBlockMap64::MakeAllPagesReadWrite
                  (&((Recycler *)CONCAT44(local_40._4_4_,local_40._0_4_))->heapBlockMap,
                   (Recycler *)CONCAT44(local_40._4_4_,local_40._0_4_));
        protectPages.recycler._0_1_ = '\0';
      }
      bVar4 = Sweep(this,rescanRootBytes,bVar4,true);
      AutoProtectPages::~AutoProtectPages((AutoProtectPages *)local_40);
      goto LAB_007123e2;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    flags_00 = 0x1776;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1776,"(this->collectionState == CollectionStateTransferSweptWait)",
                       "Do we need to handle this state?");
    if (!bVar4) goto LAB_0071249e;
    *puVar7 = 0;
  }
  FinishTransferSwept(this,flags_00);
  bVar4 = false;
LAB_007123e2:
  FinishCollection(this,bVar4);
  if ((this->collectionState).value == CollectionStateNotCollecting) {
    if ((this->inExhaustiveCollection == true) && ((this->hasExhaustiveCandidate & 1U) != 0)) {
      DoCollect(this,flags & ~CollectMode_Partial);
    }
    else {
      EndCollection(this);
    }
  }
  return 1;
}

Assistant:

BOOL
Recycler::FinishConcurrentCollect(CollectionFlags flags)
{
    if (!this->IsConcurrentState())
    {
        Assert(false);
        return false;
    }

#ifdef PROFILE_EXEC
    Js::Phase concurrentPhase = Js::ConcurrentCollectPhase;
    // TODO: Remove this workaround for unreferenced local after enabled -profile for GC
    static_cast<Js::Phase>(concurrentPhase);
#endif
#if ENABLE_PARTIAL_GC
    RECYCLER_PROFILE_EXEC_BEGIN2(this, Js::RecyclerPhase,
        (concurrentPhase = ((this->inPartialCollectMode && this->IsConcurrentMarkState())?
            Js::ConcurrentPartialCollectPhase : Js::ConcurrentCollectPhase)));
#else
    RECYCLER_PROFILE_EXEC_BEGIN2(this, Js::RecyclerPhase,
        (concurrentPhase = Js::ConcurrentCollectPhase));
#endif

    // Don't do concurrent sweep if we have priority boosted.
    const BOOL forceInThread = flags & CollectOverride_ForceInThread;
    bool concurrent = (flags & CollectMode_Concurrent) != 0;
    concurrent = concurrent && (!priorityBoost || this->backgroundRescanCount != 1);
#ifdef RECYCLER_TRACE
    collectionParam.priorityBoostConcurrentSweepOverride = priorityBoost;
#endif

    const DWORD waitTime = forceInThread? INFINITE : RecyclerHeuristic::FinishConcurrentCollectWaitTime(this->GetRecyclerFlagsTable());
    GCETW(GC_FINISHCONCURRENTWAIT_START, (this, waitTime));
    const BOOL waited = WaitForConcurrentThread(waitTime, RecyclerWaitReason::FinishConcurrentCollect);
    GCETW(GC_FINISHCONCURRENTWAIT_STOP, (this, !waited));
    if (!waited)
    {
        RECYCLER_PROFILE_EXEC_END2(this, concurrentPhase, Js::RecyclerPhase);
        return false;
    }

    bool needConcurrentSweep = false;
    if (collectionState == CollectionStateRescanWait)
    {
        GCETW_INTERNAL(GC_START, (this, ETWEvent_ConcurrentRescan));
        GCETW_INTERNAL(GC_START2, (this, ETWEvent_ConcurrentRescan, this->collectionStartReason, this->collectionStartFlags));

#ifdef RECYCLER_TRACE
#if ENABLE_PARTIAL_GC
        PrintCollectTrace(this->inPartialCollectMode ? Js::ConcurrentPartialCollectPhase : Js::ConcurrentMarkPhase, true);
#else
        PrintCollectTrace(Js::ConcurrentMarkPhase, true);
#endif
#endif
        SetCollectionState(CollectionStateRescanFindRoots);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        // TODO: Change this behavior
        // ProtectPagesOnRescan is not supported in PageHeap mode because the page protection is changed
        // outside the PageAllocator in PageHeap mode and so pages are not in the state that the
        // PageAllocator expects when it goes to change the page protection
        // One viable fix is to move the guard page protection logic outside of the heap blocks
        // and into the page allocator
        AssertMsg(!(IsPageHeapEnabled() && GetRecyclerFlagsTable().RecyclerProtectPagesOnRescan), "ProtectPagesOnRescan not supported in page heap mode");
        AutoProtectPages protectPages(this, GetRecyclerFlagsTable().RecyclerProtectPagesOnRescan);
#endif

        const bool backgroundFinishMark = !forceInThread && concurrent && ((flags & CollectOverride_BackgroundFinishMark) != 0);
        const DWORD finishMarkWaitTime = RecyclerHeuristic::BackgroundFinishMarkWaitTime(backgroundFinishMark, GetRecyclerFlagsTable());
        size_t rescanRootBytes = FinishMark(finishMarkWaitTime);

        if (rescanRootBytes == Recycler::InvalidScanRootBytes)
        {
            Assert(this->IsMarkState());
            RECYCLER_PROFILE_EXEC_END2(this, concurrentPhase, Js::RecyclerPhase);
            GCETW_INTERNAL(GC_STOP, (this, ETWEvent_ConcurrentRescan));
            GCETW_INTERNAL(GC_STOP2, (this, ETWEvent_ConcurrentRescan, this->collectionStartReason, this->collectionStartFlags));

            // we timeout trying to mark.
            return false;
        }

#ifdef RECYCLER_STATS
        collectionStats.continueCollectAllocBytes = autoHeap.uncollectedAllocBytes;
#endif

#ifdef RECYCLER_VERIFY_MARK
        if (GetRecyclerFlagsTable().RecyclerVerifyMark)
        {
            this->VerifyMark();
        }
#endif

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        protectPages.Unprotect();
#endif

#if ENABLE_PARTIAL_GC
        needConcurrentSweep = this->Sweep(rescanRootBytes, concurrent, true);
#else
        needConcurrentSweep = this->Sweep(concurrent);
#endif
        GCETW_INTERNAL(GC_STOP, (this, ETWEvent_ConcurrentRescan));
        GCETW_INTERNAL(GC_STOP2, (this, ETWEvent_ConcurrentRescan, this->collectionStartReason, this->collectionStartFlags));
    }
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    else if (collectionState == CollectionStateConcurrentSweepPass1Wait)
    {
        this->FinishSweepPrep();

        if (forceInThread)
        {
            this->FinishConcurrentSweepPass1();
            this->SetCollectionState(CollectionStateConcurrentSweepPass2);
#ifdef RECYCLER_TRACE
            if (this->GetRecyclerFlagsTable().Trace.IsEnabled(Js::ConcurrentSweepPhase) && CONFIG_FLAG_RELEASE(Verbose))
            {
                Output::Print(_u("[GC #%d] Finishing Sweep Pass2 in-thread. \n"), this->collectionCount);
            }
#endif
            this->recyclerSweepManager->FinishSweep();
            this->FinishConcurrentSweep();
            this->recyclerSweepManager->EndBackground();

            uint sweptBytes = 0;
#ifdef RECYCLER_STATS
            sweptBytes = (uint)collectionStats.objectSweptBytes;
#endif

            GCETW(GC_BACKGROUNDSWEEP_STOP, (this, sweptBytes));

            this->SetCollectionState(CollectionStateTransferSweptWait);
            RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::ConcurrentSweepPhase);

            FinishTransferSwept(flags);
        }
        else
        {
            needConcurrentSweep = true;
            // Signal the background thread to finish concurrent sweep Pass2 for all the buckets.
            StartConcurrent(CollectionStateConcurrentSweepPass2);
        }
    }
#endif
    else
    {
        AssertMsg(this->collectionState == CollectionStateTransferSweptWait, "Do we need to handle this state?");
        FinishTransferSwept(flags);
    }